

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O1

int TIFFWriteDirectoryTagCheckedLong
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t value)

{
  int iVar1;
  uint32_t m;
  
  if ((tif->tif_flags & 0x80) != 0) {
    TIFFSwabLong(&m);
  }
  iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,4,1,4,&m);
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagCheckedLong(TIFF *tif, uint32_t *ndir,
                                            TIFFDirEntry *dir, uint16_t tag,
                                            uint32_t value)
{
    uint32_t m;
    assert(sizeof(uint32_t) == 4);
    m = value;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong(&m);
    return (
        TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_LONG, 1, 4, &m));
}